

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# I64ToI32Lowering.cpp
# Opt level: O1

TempVar * __thiscall
wasm::I64ToI32Lowering::fetchOutParam
          (TempVar *__return_storage_ptr__,I64ToI32Lowering *this,Expression *e)

{
  ulong uVar1;
  __hash_code __code;
  ulong uVar2;
  _Hash_node_base *p_Var3;
  __node_base_ptr p_Var4;
  __node_base_ptr p_Var5;
  Expression *local_20;
  Expression *e_local;
  
  uVar1 = (this->highBitVars)._M_h._M_bucket_count;
  uVar2 = (ulong)e % uVar1;
  p_Var4 = (this->highBitVars)._M_h._M_buckets[uVar2];
  p_Var5 = (__node_base_ptr)0x0;
  if ((p_Var4 != (__node_base_ptr)0x0) &&
     (p_Var3 = p_Var4->_M_nxt, p_Var5 = p_Var4, (Expression *)p_Var4->_M_nxt[1]._M_nxt != e)) {
    while (p_Var4 = p_Var3, p_Var3 = p_Var4->_M_nxt, p_Var3 != (_Hash_node_base *)0x0) {
      p_Var5 = (__node_base_ptr)0x0;
      if (((ulong)p_Var3[1]._M_nxt % uVar1 != uVar2) ||
         (p_Var5 = p_Var4, (Expression *)p_Var3[1]._M_nxt == e)) goto LAB_008e24ca;
    }
    p_Var5 = (__node_base_ptr)0x0;
  }
LAB_008e24ca:
  if (p_Var5 == (__node_base_ptr)0x0) {
    p_Var3 = (_Hash_node_base *)0x0;
  }
  else {
    p_Var3 = p_Var5->_M_nxt;
  }
  local_20 = e;
  if (p_Var3 == (_Hash_node_base *)0x0) {
    __assert_fail("outParamIt != highBitVars.end()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/I64ToI32Lowering.cpp"
                  ,0x668,"TempVar wasm::I64ToI32Lowering::fetchOutParam(Expression *)");
  }
  TempVar::TempVar(__return_storage_ptr__,(TempVar *)(p_Var3 + 2));
  std::
  _Hashtable<wasm::Expression_*,_std::pair<wasm::Expression_*const,_wasm::I64ToI32Lowering::TempVar>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::I64ToI32Lowering::TempVar>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::_M_erase(&(this->highBitVars)._M_h,&local_20);
  return __return_storage_ptr__;
}

Assistant:

TempVar fetchOutParam(Expression* e) {
    auto outParamIt = highBitVars.find(e);
    assert(outParamIt != highBitVars.end());
    TempVar ret = std::move(outParamIt->second);
    highBitVars.erase(e);
    return ret;
  }